

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O3

void __thiscall ParseInt8_SignedAndUnsigned_Test::TestBody(ParseInt8_SignedAndUnsigned_Test *this)

{
  anon_unknown.dwarf_bcdf7::AssertInt8Equals(0x80,"-128",SignedAndUnsigned);
  anon_unknown.dwarf_bcdf7::AssertInt8Equals(0x80,"-0x80",SignedAndUnsigned);
  anon_unknown.dwarf_bcdf7::AssertInt8Equals(0xff,"-1",SignedAndUnsigned);
  anon_unknown.dwarf_bcdf7::AssertInt8Equals(0xff,"-0x1",SignedAndUnsigned);
  anon_unknown.dwarf_bcdf7::AssertInt8Equals('\x01',"+1",SignedAndUnsigned);
  anon_unknown.dwarf_bcdf7::AssertInt8Equals(0x85,"-0x7B",SignedAndUnsigned);
  anon_unknown.dwarf_bcdf7::AssertInt8Equals(0xab,"+0xab",SignedAndUnsigned);
  return;
}

Assistant:

TEST(ParseInt8, SignedAndUnsigned) {
  AssertInt8Equals(128, "-128", SignedAndUnsigned);
  AssertInt8Equals(-0x80, "-0x80", SignedAndUnsigned);
  AssertInt8Equals(255, "-1", SignedAndUnsigned);
  AssertInt8Equals(-1, "-0x1", SignedAndUnsigned);
  AssertInt8Equals(1, "+1", SignedAndUnsigned);
  AssertInt8Equals(-0x7b, "-0x7B", SignedAndUnsigned);
  AssertInt8Equals(0xab, "+0xab", SignedAndUnsigned);
}